

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto3_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto3_unittest::TestProto3BytesMap::_InternalSerialize
          (TestProto3BytesMap *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  UntypedMapBase *pUVar3;
  reference key;
  reference key_00;
  size_type sVar4;
  WireFormatLite *pWVar5;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  string_view field_name_00;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  reference local_140;
  value_type *entry_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3_3;
  char *local_f8;
  reference local_f0;
  value_type *entry_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field_1;
  value_type *entry_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3_1;
  value_type *entry;
  const_iterator __end3;
  MapSorterIt<std::pair<int,_const_void_*>_> local_58;
  const_iterator __begin3;
  MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *field;
  uint32_t cached_has_bits;
  TestProto3BytesMap *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestProto3BytesMap *this_local;
  
  pUVar3 = (UntypedMapBase *)_internal_map_bytes_abi_cxx11_(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar3);
  stream_local = (EpsCopyOutputStream *)target;
  if (!bVar1) {
    pUVar3 = (UntypedMapBase *)_internal_map_bytes_abi_cxx11_(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar4 = google::protobuf::internal::UntypedMapBase::size(pUVar3), 1 < sVar4)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3,
                      (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pUVar3);
      local_58.ptr = (pair<int,_const_void_*> *)
                     google::protobuf::internal::
                     MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__begin3);
      entry = (value_type *)
              google::protobuf::internal::
              MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin3);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&local_58,(MapSorterIt<std::pair<int,_const_void_*>_> *)&entry),
            bVar1) {
        key = google::protobuf::internal::
              MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::const_iterator::operator*((const_iterator *)&local_58);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                       ::InternalSerialize(1,&key->first,&key->second,(uint8_t *)stream_local,stream
                                          );
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&local_58);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3);
    }
    else {
      google::protobuf::
      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      begin((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_,
            (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pUVar3);
      google::protobuf::
      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      end((const_iterator *)&entry_1,
          (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)pUVar3);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_1), bVar1) {
        key_00 = google::protobuf::
                 Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::const_iterator::operator*
                           ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                       ::InternalSerialize(1,&key_00->first,&key_00->second,(uint8_t *)stream_local,
                                           stream);
        google::protobuf::
        Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        const_iterator::operator++
                  ((const_iterator *)&__end3_1.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  pUVar3 = (UntypedMapBase *)_internal_map_string_abi_cxx11_(this);
  bVar1 = google::protobuf::internal::UntypedMapBase::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = (UntypedMapBase *)_internal_map_string_abi_cxx11_(this);
    bVar1 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar4 = google::protobuf::internal::UntypedMapBase::size(pUVar3), 1 < sVar4)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3_2,
                      (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pUVar3);
      __end3_2 = google::protobuf::internal::
                 MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin3_2);
      entry_2 = (value_type *)
                google::protobuf::internal::
                MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3_2);
      while (bVar1 = google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::
                     operator!=(&__end3_2.super_MapSorterIt<std::pair<int,_const_void_*>_>,
                                (MapSorterIt<std::pair<int,_const_void_*>_> *)&entry_2), bVar1) {
        local_f0 = google::protobuf::internal::
                   MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::const_iterator::operator*(&__end3_2);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(2,&local_f0->first,&local_f0->second,
                                           (uint8_t *)stream_local,stream);
        pWVar5 = (WireFormatLite *)std::__cxx11::string::data();
        uVar2 = std::__cxx11::string::length();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_3,
                   "proto3_unittest.TestProto3BytesMap.map_string");
        field_name._M_str = in_R9;
        field_name._M_len = (size_t)local_f8;
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (pWVar5,(char *)(ulong)uVar2,1,(Operation)__range3_3,field_name);
        google::protobuf::internal::MapSorterIt<std::pair<int,_const_void_*>_>::operator++
                  (&__end3_2.super_MapSorterIt<std::pair<int,_const_void_*>_>);
      }
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3_2);
    }
    else {
      google::protobuf::
      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      begin((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_,
            (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pUVar3);
      google::protobuf::
      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      end((const_iterator *)&entry_3,
          (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)pUVar3);
      while (bVar1 = google::protobuf::operator!=
                               ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_3), bVar1) {
        local_140 = google::protobuf::
                    Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::const_iterator::operator*
                              ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       google::protobuf::internal::
                       MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                       ::InternalSerialize(2,&local_140->first,&local_140->second,
                                           (uint8_t *)stream_local,stream);
        pWVar5 = (WireFormatLite *)std::__cxx11::string::data();
        uVar2 = std::__cxx11::string::length();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_150,"proto3_unittest.TestProto3BytesMap.map_string");
        field_name_00._M_str = in_R9;
        field_name_00._M_len = (size_t)local_150._M_str;
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (pWVar5,(char *)(ulong)uVar2,1,(Operation)local_150._M_len,field_name_00);
        google::protobuf::
        Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        const_iterator::operator++
                  ((const_iterator *)&__end3_3.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestProto3BytesMap::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestProto3BytesMap& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.TestProto3BytesMap)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<int32, bytes> map_bytes = 1;
  if (!this_._internal_map_bytes().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_BYTES>;
    const auto& field = this_._internal_map_bytes();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, string> map_string = 2;
  if (!this_._internal_map_string().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_map_string();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.second.data(), static_cast<int>(entry.second.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto3_unittest.TestProto3BytesMap.map_string");
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.second.data(), static_cast<int>(entry.second.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto3_unittest.TestProto3BytesMap.map_string");
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.TestProto3BytesMap)
  return target;
}